

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O3

bool SparseKeyTest<1536,Blob<160>>
               (hashfunc<Blob<160>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  int iVar3;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> hashes;
  Blob<160> h;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> local_138;
  value_type local_118;
  Blob<1536> local_f8;
  
  pcVar2 = "exactly";
  iVar3 = (int)CONCAT71(in_register_00000011,inclusive);
  if (iVar3 != 0) {
    pcVar2 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x600,pcVar2,(ulong)(uint)setbits)
  ;
  local_138.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.bytes[0x80] = '\0';
  local_f8.bytes[0x81] = '\0';
  local_f8.bytes[0x82] = '\0';
  local_f8.bytes[0x83] = '\0';
  local_f8.bytes[0x84] = '\0';
  local_f8.bytes[0x85] = '\0';
  local_f8.bytes[0x86] = '\0';
  local_f8.bytes[0x87] = '\0';
  local_f8.bytes[0x88] = '\0';
  local_f8.bytes[0x89] = '\0';
  local_f8.bytes[0x8a] = '\0';
  local_f8.bytes[0x8b] = '\0';
  local_f8.bytes[0x8c] = '\0';
  local_f8.bytes[0x8d] = '\0';
  local_f8.bytes[0x8e] = '\0';
  local_f8.bytes[0x8f] = '\0';
  local_f8.bytes[0x90] = '\0';
  local_f8.bytes[0x91] = '\0';
  local_f8.bytes[0x92] = '\0';
  local_f8.bytes[0x93] = '\0';
  local_f8.bytes[0x94] = '\0';
  local_f8.bytes[0x95] = '\0';
  local_f8.bytes[0x96] = '\0';
  local_f8.bytes[0x97] = '\0';
  local_f8.bytes[0x98] = '\0';
  local_f8.bytes[0x99] = '\0';
  local_f8.bytes[0x9a] = '\0';
  local_f8.bytes[0x9b] = '\0';
  local_f8.bytes[0x9c] = '\0';
  local_f8.bytes[0x9d] = '\0';
  local_f8.bytes[0x9e] = '\0';
  local_f8.bytes[0x9f] = '\0';
  local_f8.bytes[0xa0] = '\0';
  local_f8.bytes[0xa1] = '\0';
  local_f8.bytes[0xa2] = '\0';
  local_f8.bytes[0xa3] = '\0';
  local_f8.bytes[0xa4] = '\0';
  local_f8.bytes[0xa5] = '\0';
  local_f8.bytes[0xa6] = '\0';
  local_f8.bytes[0xa7] = '\0';
  local_f8.bytes[0xa8] = '\0';
  local_f8.bytes[0xa9] = '\0';
  local_f8.bytes[0xaa] = '\0';
  local_f8.bytes[0xab] = '\0';
  local_f8.bytes[0xac] = '\0';
  local_f8.bytes[0xad] = '\0';
  local_f8.bytes[0xae] = '\0';
  local_f8.bytes[0xaf] = '\0';
  local_f8.bytes[0xb0] = '\0';
  local_f8.bytes[0xb1] = '\0';
  local_f8.bytes[0xb2] = '\0';
  local_f8.bytes[0xb3] = '\0';
  local_f8.bytes[0xb4] = '\0';
  local_f8.bytes[0xb5] = '\0';
  local_f8.bytes[0xb6] = '\0';
  local_f8.bytes[0xb7] = '\0';
  local_f8.bytes[0xb8] = '\0';
  local_f8.bytes[0xb9] = '\0';
  local_f8.bytes[0xba] = '\0';
  local_f8.bytes[0xbb] = '\0';
  local_f8.bytes[0xbc] = '\0';
  local_f8.bytes[0xbd] = '\0';
  local_f8.bytes[0xbe] = '\0';
  local_f8.bytes[0xbf] = '\0';
  local_f8.bytes[0x40] = '\0';
  local_f8.bytes[0x41] = '\0';
  local_f8.bytes[0x42] = '\0';
  local_f8.bytes[0x43] = '\0';
  local_f8.bytes[0x44] = '\0';
  local_f8.bytes[0x45] = '\0';
  local_f8.bytes[0x46] = '\0';
  local_f8.bytes[0x47] = '\0';
  local_f8.bytes[0x48] = '\0';
  local_f8.bytes[0x49] = '\0';
  local_f8.bytes[0x4a] = '\0';
  local_f8.bytes[0x4b] = '\0';
  local_f8.bytes[0x4c] = '\0';
  local_f8.bytes[0x4d] = '\0';
  local_f8.bytes[0x4e] = '\0';
  local_f8.bytes[0x4f] = '\0';
  local_f8.bytes[0x50] = '\0';
  local_f8.bytes[0x51] = '\0';
  local_f8.bytes[0x52] = '\0';
  local_f8.bytes[0x53] = '\0';
  local_f8.bytes[0x54] = '\0';
  local_f8.bytes[0x55] = '\0';
  local_f8.bytes[0x56] = '\0';
  local_f8.bytes[0x57] = '\0';
  local_f8.bytes[0x58] = '\0';
  local_f8.bytes[0x59] = '\0';
  local_f8.bytes[0x5a] = '\0';
  local_f8.bytes[0x5b] = '\0';
  local_f8.bytes[0x5c] = '\0';
  local_f8.bytes[0x5d] = '\0';
  local_f8.bytes[0x5e] = '\0';
  local_f8.bytes[0x5f] = '\0';
  local_f8.bytes[0x60] = '\0';
  local_f8.bytes[0x61] = '\0';
  local_f8.bytes[0x62] = '\0';
  local_f8.bytes[99] = '\0';
  local_f8.bytes[100] = '\0';
  local_f8.bytes[0x65] = '\0';
  local_f8.bytes[0x66] = '\0';
  local_f8.bytes[0x67] = '\0';
  local_f8.bytes[0x68] = '\0';
  local_f8.bytes[0x69] = '\0';
  local_f8.bytes[0x6a] = '\0';
  local_f8.bytes[0x6b] = '\0';
  local_f8.bytes[0x6c] = '\0';
  local_f8.bytes[0x6d] = '\0';
  local_f8.bytes[0x6e] = '\0';
  local_f8.bytes[0x6f] = '\0';
  local_f8.bytes[0x70] = '\0';
  local_f8.bytes[0x71] = '\0';
  local_f8.bytes[0x72] = '\0';
  local_f8.bytes[0x73] = '\0';
  local_f8.bytes[0x74] = '\0';
  local_f8.bytes[0x75] = '\0';
  local_f8.bytes[0x76] = '\0';
  local_f8.bytes[0x77] = '\0';
  local_f8.bytes[0x78] = '\0';
  local_f8.bytes[0x79] = '\0';
  local_f8.bytes[0x7a] = '\0';
  local_f8.bytes[0x7b] = '\0';
  local_f8.bytes[0x7c] = '\0';
  local_f8.bytes[0x7d] = '\0';
  local_f8.bytes[0x7e] = '\0';
  local_f8.bytes[0x7f] = '\0';
  local_f8.bytes[0] = '\0';
  local_f8.bytes[1] = '\0';
  local_f8.bytes[2] = '\0';
  local_f8.bytes[3] = '\0';
  local_f8.bytes[4] = '\0';
  local_f8.bytes[5] = '\0';
  local_f8.bytes[6] = '\0';
  local_f8.bytes[7] = '\0';
  local_f8.bytes[8] = '\0';
  local_f8.bytes[9] = '\0';
  local_f8.bytes[10] = '\0';
  local_f8.bytes[0xb] = '\0';
  local_f8.bytes[0xc] = '\0';
  local_f8.bytes[0xd] = '\0';
  local_f8.bytes[0xe] = '\0';
  local_f8.bytes[0xf] = '\0';
  local_f8.bytes[0x10] = '\0';
  local_f8.bytes[0x11] = '\0';
  local_f8.bytes[0x12] = '\0';
  local_f8.bytes[0x13] = '\0';
  local_f8.bytes[0x14] = '\0';
  local_f8.bytes[0x15] = '\0';
  local_f8.bytes[0x16] = '\0';
  local_f8.bytes[0x17] = '\0';
  local_f8.bytes[0x18] = '\0';
  local_f8.bytes[0x19] = '\0';
  local_f8.bytes[0x1a] = '\0';
  local_f8.bytes[0x1b] = '\0';
  local_f8.bytes[0x1c] = '\0';
  local_f8.bytes[0x1d] = '\0';
  local_f8.bytes[0x1e] = '\0';
  local_f8.bytes[0x1f] = '\0';
  local_f8.bytes[0x20] = '\0';
  local_f8.bytes[0x21] = '\0';
  local_f8.bytes[0x22] = '\0';
  local_f8.bytes[0x23] = '\0';
  local_f8.bytes[0x24] = '\0';
  local_f8.bytes[0x25] = '\0';
  local_f8.bytes[0x26] = '\0';
  local_f8.bytes[0x27] = '\0';
  local_f8.bytes[0x28] = '\0';
  local_f8.bytes[0x29] = '\0';
  local_f8.bytes[0x2a] = '\0';
  local_f8.bytes[0x2b] = '\0';
  local_f8.bytes[0x2c] = '\0';
  local_f8.bytes[0x2d] = '\0';
  local_f8.bytes[0x2e] = '\0';
  local_f8.bytes[0x2f] = '\0';
  local_f8.bytes[0x30] = '\0';
  local_f8.bytes[0x31] = '\0';
  local_f8.bytes[0x32] = '\0';
  local_f8.bytes[0x33] = '\0';
  local_f8.bytes[0x34] = '\0';
  local_f8.bytes[0x35] = '\0';
  local_f8.bytes[0x36] = '\0';
  local_f8.bytes[0x37] = '\0';
  local_f8.bytes[0x38] = '\0';
  local_f8.bytes[0x39] = '\0';
  local_f8.bytes[0x3a] = '\0';
  local_f8.bytes[0x3b] = '\0';
  local_f8.bytes[0x3c] = '\0';
  local_f8.bytes[0x3d] = '\0';
  local_f8.bytes[0x3e] = '\0';
  local_f8.bytes[0x3f] = '\0';
  if (iVar3 != 0) {
    local_118.bytes[0] = '\0';
    local_118.bytes[1] = '\0';
    local_118.bytes[2] = '\0';
    local_118.bytes[3] = '\0';
    local_118.bytes[4] = '\0';
    local_118.bytes[5] = '\0';
    local_118.bytes[6] = '\0';
    local_118.bytes[7] = '\0';
    local_118.bytes[8] = '\0';
    local_118.bytes[9] = '\0';
    local_118.bytes[10] = '\0';
    local_118.bytes[0xb] = '\0';
    local_118.bytes[0xc] = '\0';
    local_118.bytes[0xd] = '\0';
    local_118.bytes[0xe] = '\0';
    local_118.bytes[0xf] = '\0';
    local_118.bytes[0x10] = '\0';
    local_118.bytes[0x11] = '\0';
    local_118.bytes[0x12] = '\0';
    local_118.bytes[0x13] = '\0';
    (*hash.m_hash)(&local_f8,0xc0,0,&local_118);
    std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::push_back(&local_138,&local_118);
  }
  SparseKeygenRecurse<Blob<1536>,Blob<160>>(hash.m_hash,0,setbits,inclusive,&local_f8,&local_138);
  printf("%d keys\n",
         (ulong)(uint)((int)((ulong)((long)local_138.
                                           super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_138.
                                          super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                      -0x33333333));
  bVar1 = TestHashList<Blob<160>>(&local_138,drawDiagram,testColl,testDist,true,true);
  putchar(10);
  if (local_138.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}